

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::fatal<>(ValidationContext *this,IssueFatal *issue)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  ValidationReport *report_00;
  undefined8 uVar2;
  function<void_(const_ktx::ValidationReport_&)> *extraout_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined1 in_stack_000000a8 [16];
  ValidationReport report;
  ValidationReport *in_stack_fffffffffffffe38;
  basic_string_view<char> *in_stack_fffffffffffffe40;
  function<void_(const_ktx::ValidationReport_&)> *this_00;
  size_t in_stack_fffffffffffffe48;
  FatalValidationError *this_01;
  ValidationReport *this_02;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined8 local_138;
  undefined8 local_130;
  allocator<char> local_111;
  undefined1 local_110;
  undefined2 local_10e;
  undefined1 local_108 [80];
  ValidationReport *local_b8 [2];
  size_type local_a8;
  ValidationReport **local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  FatalValidationError *local_78;
  undefined8 *local_70;
  ValidationReport **local_58;
  size_type *local_50;
  ValidationReport **local_48;
  undefined8 local_40;
  size_type *local_38;
  ValidationReport **local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  local_108._64_8_ = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  local_110 = *(undefined1 *)local_108._64_8_;
  local_10e = *(undefined2 *)(local_108._64_8_ + 2);
  this_02 = (ValidationReport *)local_108;
  __a = &local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe80,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),__a);
  this_01 = (FatalValidationError *)(local_108 + 0x20);
  local_18 = (undefined8 *)(local_108._64_8_ + 0x18);
  local_10 = &local_138;
  local_28 = *local_18;
  local_20 = *(undefined8 *)(local_108._64_8_ + 0x20);
  s._M_str = (char *)this_01;
  s._M_len = in_stack_fffffffffffffe48;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffe40,s);
  local_8 = local_18;
  local_88 = local_138;
  uStack_80 = local_130;
  local_70 = &local_88;
  local_78 = this_01;
  report_00 = (ValidationReport *)
              ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                        ();
  local_50 = &local_a8;
  local_58 = local_b8;
  local_40 = 0;
  local_a8 = 0;
  this_00 = extraout_RDX;
  local_b8[0] = report_00;
  local_48 = local_58;
  local_38 = local_50;
  local_30 = local_58;
  local_a0 = local_58;
  ::fmt::v10::vformat_abi_cxx11_((string_view)report._0_16_,(format_args)in_stack_000000a8);
  std::allocator<char>::~allocator(&local_111);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()(this_00,in_stack_fffffffffffffe38)
  ;
  uVar2 = __cxa_allocate_exception(0x58);
  ValidationReport::ValidationReport(this_02,in_RDI);
  FatalValidationError::FatalValidationError(this_01,report_00);
  __cxa_throw(uVar2,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }